

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_vertexbuffer.cpp
# Opt level: O0

void __thiscall
FFlatVertexBuffer::UpdatePlaneVertices(FFlatVertexBuffer *this,sector_t *sec,int plane)

{
  int iVar1;
  int iVar2;
  secplane_t *this_00;
  double dVar3;
  int local_44;
  FFlatVertex *pFStack_40;
  int i;
  FFlatVertex *mapvt;
  FFlatVertex *vt;
  secplane_t *splane;
  int countvt;
  int startvt;
  int plane_local;
  sector_t *sec_local;
  FFlatVertexBuffer *this_local;
  
  iVar1 = sec->vboindex[plane];
  iVar2 = sec->vbocount[plane];
  this_00 = sector_t::GetSecPlane(sec,plane);
  mapvt = TArray<FFlatVertex,_FFlatVertex>::operator[](&this->vbo_shadowdata,(long)iVar1);
  pFStack_40 = this->map + iVar1;
  for (local_44 = 0; local_44 < iVar2; local_44 = local_44 + 1) {
    dVar3 = secplane_t::ZatPoint(this_00,(double)mapvt->x,(double)mapvt->y);
    mapvt->z = (float)dVar3;
    if ((plane == 0) && ((sec->transdoor & 1U) != 0)) {
      mapvt->z = mapvt->z - 1.0;
    }
    pFStack_40->z = mapvt->z;
    mapvt = mapvt + 1;
    pFStack_40 = pFStack_40 + 1;
  }
  return;
}

Assistant:

void FFlatVertexBuffer::UpdatePlaneVertices(sector_t *sec, int plane)
{
	int startvt = sec->vboindex[plane];
	int countvt = sec->vbocount[plane];
	secplane_t &splane = sec->GetSecPlane(plane);
	FFlatVertex *vt = &vbo_shadowdata[startvt];
	FFlatVertex *mapvt = &map[startvt];
	for(int i=0; i<countvt; i++, vt++, mapvt++)
	{
		vt->z = splane.ZatPoint(vt->x, vt->y);
		if (plane == sector_t::floor && sec->transdoor) vt->z -= 1;
		mapvt->z = vt->z;
	}
}